

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void WrapAttrVal(TidyDocImpl *doc)

{
  Bool BVar1;
  uint local_1c;
  uint i;
  TidyPrintImpl *pprint;
  TidyDocImpl *doc_local;
  
  BVar1 = WantIndent(doc);
  if (BVar1 != no) {
    WriteIndentChar(doc);
  }
  for (local_1c = 0; local_1c < (doc->pprint).wraphere; local_1c = local_1c + 1) {
    prvTidyWriteChar((doc->pprint).linebuf[local_1c],doc->docOut);
  }
  BVar1 = IsWrapInString(&doc->pprint);
  if (BVar1 == no) {
    prvTidyWriteChar(0x20,doc->docOut);
  }
  else {
    prvTidyWriteChar(0x5c,doc->docOut);
  }
  prvTidyWriteChar(10,doc->docOut);
  (doc->pprint).line = (doc->pprint).line + 1;
  ResetLineAfterWrap(&doc->pprint);
  return;
}

Assistant:

static void WrapAttrVal( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;
    uint i;

    if ( WantIndent(doc) )
        WriteIndentChar(doc);

    for ( i = 0; i < pprint->wraphere; ++i )
        TY_(WriteChar)( pprint->linebuf[i], doc->docOut );

    if ( IsWrapInString(pprint) )
        TY_(WriteChar)( '\\', doc->docOut );
    else
        TY_(WriteChar)( ' ', doc->docOut );

    TY_(WriteChar)( '\n', doc->docOut );
    pprint->line++;
    ResetLineAfterWrap( pprint );
}